

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

void __thiscall
icu_63::PluralAvailableLocalesEnumeration::PluralAvailableLocalesEnumeration
          (PluralAvailableLocalesEnumeration *this,UErrorCode *status)

{
  undefined1 *status_00;
  UErrorCode UVar1;
  UResourceBundle *pUVar2;
  LocalUResourceBundlePointer rb;
  LocalUResourceBundlePointer local_18;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__PluralAvailableLocalesEnumeration_003a9cf8;
  this->fLocales = (UResourceBundle *)0x0;
  this->fRes = (UResourceBundle *)0x0;
  UVar1 = *status;
  *(UErrorCode *)&(this->super_StringEnumeration).field_0x74 = UVar1;
  if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
    status_00 = &(this->super_StringEnumeration).field_0x74;
    *(undefined4 *)status_00 = 0;
    local_18.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)
         ures_openDirect_63((char *)0x0,"plurals",(UErrorCode *)status_00);
    pUVar2 = ures_getByKey_63((UResourceBundle *)
                              local_18.super_LocalPointerBase<UResourceBundle>.ptr,"locales",
                              (UResourceBundle *)0x0,(UErrorCode *)status_00);
    this->fLocales = pUVar2;
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_18);
  }
  return;
}

Assistant:

PluralAvailableLocalesEnumeration::PluralAvailableLocalesEnumeration(UErrorCode &status) {
    fOpenStatus = status;
    if (U_FAILURE(status)) {
        return;
    }
    fOpenStatus = U_ZERO_ERROR; // clear any warnings.
    LocalUResourceBundlePointer rb(ures_openDirect(nullptr, "plurals", &fOpenStatus));
    fLocales = ures_getByKey(rb.getAlias(), "locales", nullptr, &fOpenStatus);
}